

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators.h
# Opt level: O2

void __thiscall spdlog::populators::pattern_populator::~pattern_populator(pattern_populator *this)

{
  (this->super_populator)._vptr_populator = (_func_int **)&PTR__pattern_populator_0015cbe0;
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (&this->pf_);
  std::__cxx11::string::~string((string *)&this->kKey);
  return;
}

Assistant:

class SPDLOG_API pattern_populator : public populator
{
protected:
    const std::string kKey;

    std::unique_ptr<spdlog::formatter> pf_;

public:
    pattern_populator(const std::string &key, const std::string &pattern);

    pattern_populator(const pattern_populator &other);

    virtual void populate(const details::log_msg &msg, nlohmann::json &dest) override;

    virtual std::unique_ptr<populator> clone() const override;
}